

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined8 uVar15;
  byte bVar16;
  uint uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  byte bVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  byte bVar29;
  uint uVar30;
  RTCRayQueryContext *pRVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  RTCIntersectArguments *pRVar35;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  float fVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined4 uVar70;
  undefined1 auVar71 [32];
  float fVar72;
  undefined1 auVar73 [16];
  undefined8 uVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar94 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_27ac;
  Scene *local_27a8;
  RTCFilterFunctionNArguments local_27a0;
  RTCIntersectArguments *local_2770;
  ulong local_2768;
  ulong *local_2760;
  long local_2758;
  float local_2750;
  undefined4 local_274c;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined4 local_2740;
  undefined4 local_273c;
  uint local_2738;
  uint local_2734;
  uint local_2730;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar41 [16];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2760 = local_2390;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar10 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar11 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar39._8_4_ = 0x7fffffff;
    auVar39._0_8_ = 0x7fffffff7fffffff;
    auVar39._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx512vl((undefined1  [16])aVar2,auVar39);
    auVar40._8_4_ = 0x219392ef;
    auVar40._0_8_ = 0x219392ef219392ef;
    auVar40._12_4_ = 0x219392ef;
    uVar32 = vcmpps_avx512vl(auVar39,auVar40,1);
    local_2398[0] = 0;
    auVar73._8_4_ = 0x3f800000;
    auVar73._0_8_ = 0x3f8000003f800000;
    auVar73._12_4_ = 0x3f800000;
    auVar39 = vdivps_avx(auVar73,(undefined1  [16])aVar2);
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar9 = (bool)((byte)uVar32 & 1);
    auVar41._0_4_ = (uint)bVar9 * auVar40._0_4_ | (uint)!bVar9 * auVar39._0_4_;
    bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
    auVar41._4_4_ = (uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar39._4_4_;
    bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
    auVar41._8_4_ = (uint)bVar9 * auVar40._8_4_ | (uint)!bVar9 * auVar39._8_4_;
    bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
    auVar41._12_4_ = (uint)bVar9 * auVar40._12_4_ | (uint)!bVar9 * auVar39._12_4_;
    auVar42._8_4_ = 0x3f7ffffa;
    auVar42._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar42._12_4_ = 0x3f7ffffa;
    auVar42 = vmulps_avx512vl(auVar41,auVar42);
    auVar43._8_4_ = 0x3f800003;
    auVar43._0_8_ = 0x3f8000033f800003;
    auVar43._12_4_ = 0x3f800003;
    auVar43 = vmulps_avx512vl(auVar41,auVar43);
    uVar70 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_25a0._4_4_ = uVar70;
    local_25a0._0_4_ = uVar70;
    local_25a0._8_4_ = uVar70;
    local_25a0._12_4_ = uVar70;
    local_25a0._16_4_ = uVar70;
    local_25a0._20_4_ = uVar70;
    local_25a0._24_4_ = uVar70;
    local_25a0._28_4_ = uVar70;
    auVar79 = ZEXT3264(local_25a0);
    uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_25c0._4_4_ = uVar70;
    local_25c0._0_4_ = uVar70;
    local_25c0._8_4_ = uVar70;
    local_25c0._12_4_ = uVar70;
    local_25c0._16_4_ = uVar70;
    local_25c0._20_4_ = uVar70;
    local_25c0._24_4_ = uVar70;
    local_25c0._28_4_ = uVar70;
    auVar81 = ZEXT3264(local_25c0);
    uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_25e0._4_4_ = uVar70;
    local_25e0._0_4_ = uVar70;
    local_25e0._8_4_ = uVar70;
    local_25e0._12_4_ = uVar70;
    local_25e0._16_4_ = uVar70;
    local_25e0._20_4_ = uVar70;
    local_25e0._24_4_ = uVar70;
    local_25e0._28_4_ = uVar70;
    auVar82 = ZEXT3264(local_25e0);
    fVar72 = auVar42._0_4_;
    auVar39 = vmovshdup_avx(auVar42);
    uVar74 = auVar39._0_8_;
    local_2620._8_8_ = uVar74;
    local_2620._0_8_ = uVar74;
    local_2620._16_8_ = uVar74;
    local_2620._24_8_ = uVar74;
    auVar90 = ZEXT3264(local_2620);
    auVar45._8_4_ = 2;
    auVar45._0_8_ = 0x200000002;
    auVar45._12_4_ = 2;
    auVar45._16_4_ = 2;
    auVar45._20_4_ = 2;
    auVar45._24_4_ = 2;
    auVar45._28_4_ = 2;
    auVar40 = vshufpd_avx(auVar42,auVar42,1);
    local_2640 = vpermps_avx2(auVar45,ZEXT1632(auVar42));
    auVar93 = ZEXT3264(local_2640);
    fVar67 = auVar43._0_4_;
    auVar44._8_4_ = 1;
    auVar44._0_8_ = 0x100000001;
    auVar44._12_4_ = 1;
    auVar44._16_4_ = 1;
    auVar44._20_4_ = 1;
    auVar44._24_4_ = 1;
    auVar44._28_4_ = 1;
    local_2680 = vpermps_avx512vl(auVar44,ZEXT1632(auVar43));
    auVar101 = ZEXT3264(local_2680);
    local_26a0 = vpermps_avx512vl(auVar45,ZEXT1632(auVar43));
    auVar102 = ZEXT3264(local_26a0);
    uVar32 = (ulong)(fVar72 < 0.0) << 5;
    uVar34 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x40;
    uVar33 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x80;
    uVar36 = uVar32 ^ 0x20;
    local_26c0 = vbroadcastss_avx512vl(auVar10);
    auVar103 = ZEXT3264(local_26c0);
    uVar70 = auVar11._0_4_;
    auVar69 = ZEXT3264(CONCAT428(uVar70,CONCAT424(uVar70,CONCAT420(uVar70,CONCAT416(uVar70,CONCAT412
                                                  (uVar70,CONCAT48(uVar70,CONCAT44(uVar70,uVar70))))
                                                  ))));
    auVar104 = ZEXT3264(_DAT_01fe9900);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0xfffffff8));
    auVar105 = ZEXT3264(auVar44);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar106 = ZEXT3264(auVar44);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar107 = ZEXT3264(auVar44);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar108 = ZEXT3264(auVar44);
    local_2768 = uVar32;
    local_2600 = fVar72;
    fStack_25fc = fVar72;
    fStack_25f8 = fVar72;
    fStack_25f4 = fVar72;
    fStack_25f0 = fVar72;
    fStack_25ec = fVar72;
    fStack_25e8 = fVar72;
    fStack_25e4 = fVar72;
    local_2660 = fVar67;
    fStack_265c = fVar67;
    fStack_2658 = fVar67;
    fStack_2654 = fVar67;
    fStack_2650 = fVar67;
    fStack_264c = fVar67;
    fStack_2648 = fVar67;
    fStack_2644 = fVar67;
    fVar83 = fVar72;
    fVar84 = fVar72;
    fVar85 = fVar72;
    fVar86 = fVar72;
    fVar87 = fVar72;
    fVar88 = fVar72;
    fVar95 = fVar67;
    fVar96 = fVar67;
    fVar97 = fVar67;
    fVar98 = fVar67;
    fVar99 = fVar67;
    fVar100 = fVar67;
    do {
      pfVar4 = (float *)(local_2760 + -1);
      local_2760 = local_2760 + -2;
      if (*pfVar4 <= (ray->super_RayK<1>).tfar) {
        uVar37 = *local_2760;
        while ((uVar37 & 8) == 0) {
          auVar53 = auVar79._0_32_;
          auVar44 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar32),auVar53);
          auVar46._4_4_ = fVar83 * auVar44._4_4_;
          auVar46._0_4_ = fVar72 * auVar44._0_4_;
          auVar46._8_4_ = fVar84 * auVar44._8_4_;
          auVar46._12_4_ = fVar85 * auVar44._12_4_;
          auVar46._16_4_ = fVar86 * auVar44._16_4_;
          auVar46._20_4_ = fVar87 * auVar44._20_4_;
          auVar46._24_4_ = fVar88 * auVar44._24_4_;
          auVar46._28_4_ = auVar44._28_4_;
          auVar62 = auVar81._0_32_;
          auVar44 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar34),auVar62);
          auVar49._4_4_ = auVar90._4_4_ * auVar44._4_4_;
          auVar49._0_4_ = auVar90._0_4_ * auVar44._0_4_;
          auVar49._8_4_ = auVar90._8_4_ * auVar44._8_4_;
          auVar49._12_4_ = auVar90._12_4_ * auVar44._12_4_;
          auVar49._16_4_ = auVar90._16_4_ * auVar44._16_4_;
          auVar49._20_4_ = auVar90._20_4_ * auVar44._20_4_;
          auVar49._24_4_ = auVar90._24_4_ * auVar44._24_4_;
          auVar49._28_4_ = auVar44._28_4_;
          auVar44 = vmaxps_avx(auVar46,auVar49);
          auVar49 = auVar82._0_32_;
          auVar45 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar33),auVar49);
          auVar47._4_4_ = auVar93._4_4_ * auVar45._4_4_;
          auVar47._0_4_ = auVar93._0_4_ * auVar45._0_4_;
          auVar47._8_4_ = auVar93._8_4_ * auVar45._8_4_;
          auVar47._12_4_ = auVar93._12_4_ * auVar45._12_4_;
          auVar47._16_4_ = auVar93._16_4_ * auVar45._16_4_;
          auVar47._20_4_ = auVar93._20_4_ * auVar45._20_4_;
          auVar47._24_4_ = auVar93._24_4_ * auVar45._24_4_;
          auVar47._28_4_ = auVar45._28_4_;
          auVar45 = vmaxps_avx512vl(auVar47,auVar103._0_32_);
          auVar44 = vmaxps_avx(auVar44,auVar45);
          auVar45 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar36),auVar53);
          auVar48._4_4_ = fVar95 * auVar45._4_4_;
          auVar48._0_4_ = fVar67 * auVar45._0_4_;
          auVar48._8_4_ = fVar96 * auVar45._8_4_;
          auVar48._12_4_ = fVar97 * auVar45._12_4_;
          auVar48._16_4_ = fVar98 * auVar45._16_4_;
          auVar48._20_4_ = fVar99 * auVar45._20_4_;
          auVar48._24_4_ = fVar100 * auVar45._24_4_;
          auVar48._28_4_ = auVar45._28_4_;
          auVar45 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar34 ^ 0x20)),auVar62);
          auVar45 = vmulps_avx512vl(auVar101._0_32_,auVar45);
          auVar45 = vminps_avx(auVar48,auVar45);
          auVar46 = vsubps_avx(*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar33 ^ 0x20)),auVar49);
          auVar46 = vmulps_avx512vl(auVar102._0_32_,auVar46);
          auVar46 = vminps_avx(auVar46,auVar69._0_32_);
          auVar45 = vminps_avx(auVar45,auVar46);
          uVar12 = vcmpps_avx512vl(auVar44,auVar45,2);
          bVar25 = (byte)uVar12;
          if (bVar25 == 0) goto LAB_01f2831c;
          auVar45 = *(undefined1 (*) [32])(uVar37 & 0xfffffffffffffff0);
          auVar46 = ((undefined1 (*) [32])(uVar37 & 0xfffffffffffffff0))[1];
          auVar47 = vpternlogd_avx512vl(auVar104._0_32_,auVar44,auVar105._0_32_,0xf8);
          auVar48 = vpcompressd_avx512vl(auVar47);
          auVar51._0_4_ =
               (uint)(bVar25 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar47._0_4_;
          bVar9 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar51._4_4_ = (uint)bVar9 * auVar48._4_4_ | (uint)!bVar9 * auVar47._4_4_;
          bVar9 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar51._8_4_ = (uint)bVar9 * auVar48._8_4_ | (uint)!bVar9 * auVar47._8_4_;
          bVar9 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar51._12_4_ = (uint)bVar9 * auVar48._12_4_ | (uint)!bVar9 * auVar47._12_4_;
          bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
          auVar51._16_4_ = (uint)bVar9 * auVar48._16_4_ | (uint)!bVar9 * auVar47._16_4_;
          bVar9 = (bool)((byte)(uVar12 >> 5) & 1);
          auVar51._20_4_ = (uint)bVar9 * auVar48._20_4_ | (uint)!bVar9 * auVar47._20_4_;
          bVar9 = (bool)((byte)(uVar12 >> 6) & 1);
          auVar51._24_4_ = (uint)bVar9 * auVar48._24_4_ | (uint)!bVar9 * auVar47._24_4_;
          bVar9 = SUB81(uVar12 >> 7,0);
          auVar51._28_4_ = (uint)bVar9 * auVar48._28_4_ | (uint)!bVar9 * auVar47._28_4_;
          auVar47 = vpermt2q_avx512vl(auVar45,auVar51,auVar46);
          uVar37 = auVar47._0_8_;
          bVar25 = bVar25 - 1 & bVar25;
          if (bVar25 != 0) {
            auVar47 = vpshufd_avx2(auVar51,0x55);
            vpermt2q_avx512vl(auVar45,auVar47,auVar46);
            auVar48 = vpminsd_avx2(auVar51,auVar47);
            auVar47 = vpmaxsd_avx2(auVar51,auVar47);
            bVar25 = bVar25 - 1 & bVar25;
            if (bVar25 == 0) {
              auVar49 = vpermi2q_avx512vl(auVar48,auVar45,auVar46);
              uVar37 = auVar49._0_8_;
              auVar45 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
              *local_2760 = auVar45._0_8_;
              auVar44 = vpermd_avx2(auVar47,auVar44);
              *(int *)(local_2760 + 1) = auVar44._0_4_;
              local_2760 = local_2760 + 2;
            }
            else {
              auVar54 = vpshufd_avx2(auVar51,0xaa);
              vpermt2q_avx512vl(auVar45,auVar54,auVar46);
              auVar52 = vpminsd_avx2(auVar48,auVar54);
              auVar48 = vpmaxsd_avx2(auVar48,auVar54);
              auVar54 = vpminsd_avx2(auVar47,auVar48);
              auVar47 = vpmaxsd_avx2(auVar47,auVar48);
              bVar25 = bVar25 - 1 & bVar25;
              if (bVar25 == 0) {
                auVar49 = vpermi2q_avx512vl(auVar52,auVar45,auVar46);
                uVar37 = auVar49._0_8_;
                auVar49 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
                *local_2760 = auVar49._0_8_;
                auVar49 = vpermd_avx2(auVar47,auVar44);
                *(int *)(local_2760 + 1) = auVar49._0_4_;
                auVar45 = vpermt2q_avx512vl(auVar45,auVar54,auVar46);
                local_2760[2] = auVar45._0_8_;
                auVar44 = vpermd_avx2(auVar54,auVar44);
                *(int *)(local_2760 + 3) = auVar44._0_4_;
                local_2760 = local_2760 + 4;
              }
              else {
                auVar48 = vpshufd_avx2(auVar51,0xff);
                vpermt2q_avx512vl(auVar45,auVar48,auVar46);
                auVar63 = vpminsd_avx2(auVar52,auVar48);
                auVar48 = vpmaxsd_avx2(auVar52,auVar48);
                auVar52 = vpminsd_avx2(auVar54,auVar48);
                auVar48 = vpmaxsd_avx2(auVar54,auVar48);
                auVar54 = vpminsd_avx2(auVar47,auVar48);
                auVar47 = vpmaxsd_avx2(auVar47,auVar48);
                bVar25 = bVar25 - 1 & bVar25;
                if (bVar25 == 0) {
                  auVar48 = vpermi2q_avx512vl(auVar63,auVar45,auVar46);
                  uVar37 = auVar48._0_8_;
                  auVar48 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
                  *local_2760 = auVar48._0_8_;
                  auVar47 = vpermd_avx2(auVar47,auVar44);
                  *(int *)(local_2760 + 1) = auVar47._0_4_;
                  auVar47 = vpermt2q_avx512vl(auVar45,auVar54,auVar46);
                  local_2760[2] = auVar47._0_8_;
                  auVar47 = vpermd_avx2(auVar54,auVar44);
                  *(int *)(local_2760 + 3) = auVar47._0_4_;
                  auVar45 = vpermt2q_avx512vl(auVar45,auVar52,auVar46);
                  local_2760[4] = auVar45._0_8_;
                  auVar44 = vpermd_avx2(auVar52,auVar44);
                  *(int *)(local_2760 + 5) = auVar44._0_4_;
                  local_2760 = local_2760 + 6;
                }
                else {
                  auVar50 = valignd_avx512vl(auVar51,auVar51,3);
                  auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar51 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar48,auVar63);
                  auVar48 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar51 = vpermt2d_avx512vl(auVar51,auVar48,auVar52);
                  auVar51 = vpermt2d_avx512vl(auVar51,auVar48,auVar54);
                  auVar48 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar47 = vpermt2d_avx512vl(auVar51,auVar48,auVar47);
                  auVar79 = ZEXT3264(auVar47);
                  bVar29 = bVar25;
                  do {
                    auVar48 = auVar79._0_32_;
                    auVar54._8_4_ = 1;
                    auVar54._0_8_ = 0x100000001;
                    auVar54._12_4_ = 1;
                    auVar54._16_4_ = 1;
                    auVar54._20_4_ = 1;
                    auVar54._24_4_ = 1;
                    auVar54._28_4_ = 1;
                    auVar47 = vpermd_avx2(auVar54,auVar50);
                    auVar50 = valignd_avx512vl(auVar50,auVar50,1);
                    vpermt2q_avx512vl(auVar45,auVar50,auVar46);
                    bVar29 = bVar29 - 1 & bVar29;
                    uVar74 = vpcmpd_avx512vl(auVar47,auVar48,5);
                    auVar47 = vpmaxsd_avx2(auVar47,auVar48);
                    bVar16 = (byte)uVar74 << 1;
                    auVar48 = valignd_avx512vl(auVar48,auVar48,7);
                    bVar9 = (bool)((byte)uVar74 & 1);
                    auVar52._4_4_ = (uint)bVar9 * auVar48._4_4_ | (uint)!bVar9 * auVar47._4_4_;
                    auVar52._0_4_ = auVar47._0_4_;
                    bVar9 = (bool)(bVar16 >> 2 & 1);
                    auVar52._8_4_ = (uint)bVar9 * auVar48._8_4_ | (uint)!bVar9 * auVar47._8_4_;
                    bVar9 = (bool)(bVar16 >> 3 & 1);
                    auVar52._12_4_ = (uint)bVar9 * auVar48._12_4_ | (uint)!bVar9 * auVar47._12_4_;
                    bVar9 = (bool)(bVar16 >> 4 & 1);
                    auVar52._16_4_ = (uint)bVar9 * auVar48._16_4_ | (uint)!bVar9 * auVar47._16_4_;
                    bVar9 = (bool)(bVar16 >> 5 & 1);
                    auVar52._20_4_ = (uint)bVar9 * auVar48._20_4_ | (uint)!bVar9 * auVar47._20_4_;
                    bVar9 = (bool)(bVar16 >> 6 & 1);
                    auVar52._24_4_ = (uint)bVar9 * auVar48._24_4_ | (uint)!bVar9 * auVar47._24_4_;
                    auVar52._28_4_ =
                         (uint)(bVar16 >> 7) * auVar48._28_4_ |
                         (uint)!(bool)(bVar16 >> 7) * auVar47._28_4_;
                    auVar79 = ZEXT3264(auVar52);
                  } while (bVar29 != 0);
                  lVar27 = (ulong)(uint)POPCOUNT((uint)bVar25) + 3;
                  do {
                    auVar47 = vpermi2q_avx512vl(auVar52,auVar45,auVar46);
                    *local_2760 = auVar47._0_8_;
                    auVar48 = auVar79._0_32_;
                    auVar47 = vpermd_avx2(auVar48,auVar44);
                    *(int *)(local_2760 + 1) = auVar47._0_4_;
                    auVar52 = valignd_avx512vl(auVar48,auVar48,1);
                    local_2760 = local_2760 + 2;
                    auVar79 = ZEXT3264(auVar52);
                    lVar27 = lVar27 + -1;
                  } while (lVar27 != 0);
                  auVar44 = vpermt2q_avx512vl(auVar45,auVar52,auVar46);
                  uVar37 = auVar44._0_8_;
                }
                auVar79 = ZEXT3264(auVar53);
                auVar81 = ZEXT3264(auVar62);
                auVar82 = ZEXT3264(auVar49);
                auVar90 = ZEXT3264(auVar90._0_32_);
                auVar93 = ZEXT3264(auVar93._0_32_);
                auVar101 = ZEXT3264(auVar101._0_32_);
                auVar102 = ZEXT3264(auVar102._0_32_);
                auVar103 = ZEXT3264(auVar103._0_32_);
                auVar104 = ZEXT3264(auVar104._0_32_);
                auVar105 = ZEXT3264(auVar105._0_32_);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar106 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar107 = ZEXT3264(auVar44);
                auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar108 = ZEXT3264(auVar44);
              }
            }
          }
        }
        local_2758 = (ulong)((uint)uVar37 & 0xf) - 8;
        if (local_2758 != 0) {
          uVar37 = uVar37 & 0xfffffffffffffff0;
          local_27a8 = context->scene;
          lVar27 = 0;
          do {
            lVar28 = lVar27 * 0x60;
            ppfVar3 = (local_27a8->vertices).items;
            pfVar4 = ppfVar3[*(uint *)(uVar37 + 0x48 + lVar28)];
            auVar57._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar37 + 0x28 + lVar28));
            auVar57._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar37 + 8 + lVar28));
            pfVar5 = ppfVar3[*(uint *)(uVar37 + 0x40 + lVar28)];
            auVar58._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + 0x20 + lVar28));
            auVar58._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + lVar28));
            pfVar6 = ppfVar3[*(uint *)(uVar37 + 0x4c + lVar28)];
            auVar60._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x2c + lVar28));
            auVar60._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0xc + lVar28));
            pfVar7 = ppfVar3[*(uint *)(uVar37 + 0x44 + lVar28)];
            auVar64._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 0x24 + lVar28));
            auVar64._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 4 + lVar28));
            lVar1 = uVar37 + 0x40 + lVar28;
            local_2580 = *(undefined8 *)(lVar1 + 0x10);
            uStack_2578 = *(undefined8 *)(lVar1 + 0x18);
            uStack_2570 = local_2580;
            uStack_2568 = uStack_2578;
            lVar1 = uVar37 + 0x50 + lVar28;
            local_26e0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_26d8 = *(undefined8 *)(lVar1 + 0x18);
            auVar11 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar37 + 0x10 + lVar28)),
                                    *(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar37 + 0x18 + lVar28)));
            auVar39 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar37 + 0x10 + lVar28)),
                                    *(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar37 + 0x18 + lVar28)));
            auVar40 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x14 + lVar28)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar37 + 0x1c + lVar28)));
            auVar10 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x14 + lVar28)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar37 + 0x1c + lVar28)));
            auVar42 = vunpcklps_avx(auVar39,auVar10);
            auVar43 = vunpcklps_avx(auVar11,auVar40);
            auVar39 = vunpckhps_avx(auVar11,auVar40);
            auVar40 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar37 + 0x30 + lVar28)),
                                    *(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar37 + 0x38 + lVar28)));
            auVar10 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar37 + 0x30 + lVar28)),
                                    *(undefined1 (*) [16])
                                     (pfVar4 + *(uint *)(uVar37 + 0x38 + lVar28)));
            auVar41 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x34 + lVar28)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar37 + 0x3c + lVar28)));
            auVar11 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x34 + lVar28)),
                                    *(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar37 + 0x3c + lVar28)));
            auVar11 = vunpcklps_avx(auVar10,auVar11);
            auVar73 = vunpcklps_avx(auVar40,auVar41);
            auVar10 = vunpckhps_avx(auVar40,auVar41);
            uStack_26d0 = local_26e0;
            uStack_26c8 = uStack_26d8;
            auVar44 = vunpcklps_avx(auVar64,auVar60);
            auVar45 = vunpcklps_avx(auVar58,auVar57);
            auVar49 = vunpcklps_avx(auVar45,auVar44);
            auVar45 = vunpckhps_avx(auVar45,auVar44);
            auVar44 = vunpckhps_avx(auVar64,auVar60);
            auVar46 = vunpckhps_avx(auVar58,auVar57);
            auVar46 = vunpcklps_avx(auVar46,auVar44);
            auVar59._16_16_ = auVar43;
            auVar59._0_16_ = auVar43;
            auVar89._16_16_ = auVar39;
            auVar89._0_16_ = auVar39;
            auVar56._16_16_ = auVar42;
            auVar56._0_16_ = auVar42;
            auVar61._16_16_ = auVar73;
            auVar61._0_16_ = auVar73;
            auVar91._16_16_ = auVar10;
            auVar91._0_16_ = auVar10;
            uVar70 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar94._4_4_ = uVar70;
            auVar94._0_4_ = uVar70;
            auVar94._8_4_ = uVar70;
            auVar94._12_4_ = uVar70;
            auVar94._16_4_ = uVar70;
            auVar94._20_4_ = uVar70;
            auVar94._24_4_ = uVar70;
            auVar94._28_4_ = uVar70;
            auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar70 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar75._4_4_ = uVar70;
            auVar75._0_4_ = uVar70;
            auVar75._8_4_ = uVar70;
            auVar75._12_4_ = uVar70;
            auVar75._16_4_ = uVar70;
            auVar75._20_4_ = uVar70;
            auVar75._24_4_ = uVar70;
            auVar75._28_4_ = uVar70;
            auVar55._16_16_ = auVar11;
            auVar55._0_16_ = auVar11;
            uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar76._4_4_ = uVar70;
            auVar76._0_4_ = uVar70;
            auVar76._8_4_ = uVar70;
            auVar76._12_4_ = uVar70;
            auVar76._16_4_ = uVar70;
            auVar76._20_4_ = uVar70;
            auVar76._24_4_ = uVar70;
            auVar76._28_4_ = uVar70;
            fVar72 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar80._4_4_ = fVar72;
            auVar80._0_4_ = fVar72;
            auVar80._8_4_ = fVar72;
            auVar80._12_4_ = fVar72;
            auVar80._16_4_ = fVar72;
            auVar80._20_4_ = fVar72;
            auVar80._24_4_ = fVar72;
            auVar80._28_4_ = fVar72;
            auVar44 = vsubps_avx(auVar49,auVar94);
            auVar51 = vsubps_avx512vl(auVar45,auVar47);
            auVar52 = vsubps_avx512vl(auVar46,auVar48);
            auVar53 = vsubps_avx512vl(auVar59,auVar94);
            auVar54 = vsubps_avx512vl(auVar89,auVar47);
            auVar50 = vsubps_avx512vl(auVar56,auVar48);
            auVar45 = vsubps_avx(auVar61,auVar94);
            auVar47 = vsubps_avx512vl(auVar91,auVar47);
            auVar48 = vsubps_avx512vl(auVar55,auVar48);
            auVar46 = vsubps_avx(auVar45,auVar44);
            auVar49 = vsubps_avx(auVar47,auVar51);
            auVar55 = vsubps_avx512vl(auVar48,auVar52);
            auVar56 = vsubps_avx512vl(auVar44,auVar53);
            auVar57 = vsubps_avx512vl(auVar51,auVar54);
            auVar58 = vsubps_avx512vl(auVar52,auVar50);
            auVar59 = vsubps_avx512vl(auVar53,auVar45);
            auVar60 = vsubps_avx512vl(auVar54,auVar47);
            auVar61 = vsubps_avx512vl(auVar50,auVar48);
            auVar65._0_4_ = auVar45._0_4_ + auVar44._0_4_;
            auVar65._4_4_ = auVar45._4_4_ + auVar44._4_4_;
            auVar65._8_4_ = auVar45._8_4_ + auVar44._8_4_;
            auVar65._12_4_ = auVar45._12_4_ + auVar44._12_4_;
            auVar65._16_4_ = auVar45._16_4_ + auVar44._16_4_;
            auVar65._20_4_ = auVar45._20_4_ + auVar44._20_4_;
            auVar65._24_4_ = auVar45._24_4_ + auVar44._24_4_;
            auVar65._28_4_ = auVar45._28_4_ + auVar44._28_4_;
            auVar78._0_4_ = auVar47._0_4_ + auVar51._0_4_;
            auVar78._4_4_ = auVar47._4_4_ + auVar51._4_4_;
            auVar78._8_4_ = auVar47._8_4_ + auVar51._8_4_;
            auVar78._12_4_ = auVar47._12_4_ + auVar51._12_4_;
            auVar78._16_4_ = auVar47._16_4_ + auVar51._16_4_;
            auVar78._20_4_ = auVar47._20_4_ + auVar51._20_4_;
            auVar78._24_4_ = auVar47._24_4_ + auVar51._24_4_;
            auVar78._28_4_ = auVar47._28_4_ + auVar51._28_4_;
            auVar62 = vaddps_avx512vl(auVar48,auVar52);
            auVar63 = vmulps_avx512vl(auVar78,auVar55);
            auVar63 = vfmsub231ps_avx512vl(auVar63,auVar49,auVar62);
            auVar62 = vmulps_avx512vl(auVar62,auVar46);
            auVar64 = vfmsub231ps_avx512vl(auVar62,auVar55,auVar65);
            auVar62._4_4_ = auVar49._4_4_ * auVar65._4_4_;
            auVar62._0_4_ = auVar49._0_4_ * auVar65._0_4_;
            auVar62._8_4_ = auVar49._8_4_ * auVar65._8_4_;
            auVar62._12_4_ = auVar49._12_4_ * auVar65._12_4_;
            auVar62._16_4_ = auVar49._16_4_ * auVar65._16_4_;
            auVar62._20_4_ = auVar49._20_4_ * auVar65._20_4_;
            auVar62._24_4_ = auVar49._24_4_ * auVar65._24_4_;
            auVar62._28_4_ = auVar65._28_4_;
            auVar39 = vfmsub231ps_fma(auVar62,auVar46,auVar78);
            auVar71._0_4_ = fVar72 * auVar39._0_4_;
            auVar71._4_4_ = fVar72 * auVar39._4_4_;
            auVar71._8_4_ = fVar72 * auVar39._8_4_;
            auVar71._12_4_ = fVar72 * auVar39._12_4_;
            auVar71._16_4_ = fVar72 * 0.0;
            auVar71._20_4_ = fVar72 * 0.0;
            auVar71._24_4_ = fVar72 * 0.0;
            auVar71._28_4_ = 0;
            auVar62 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar64);
            local_2560 = vfmadd231ps_avx512vl(auVar62,auVar75,auVar63);
            auVar62 = vaddps_avx512vl(auVar44,auVar53);
            auVar63 = vaddps_avx512vl(auVar51,auVar54);
            auVar64 = vaddps_avx512vl(auVar52,auVar50);
            auVar65 = vmulps_avx512vl(auVar63,auVar58);
            auVar65 = vfmsub231ps_avx512vl(auVar65,auVar57,auVar64);
            auVar64 = vmulps_avx512vl(auVar64,auVar56);
            auVar64 = vfmsub231ps_avx512vl(auVar64,auVar58,auVar62);
            auVar62 = vmulps_avx512vl(auVar62,auVar57);
            auVar62 = vfmsub231ps_avx512vl(auVar62,auVar56,auVar63);
            auVar63._4_4_ = fVar72 * auVar62._4_4_;
            auVar63._0_4_ = fVar72 * auVar62._0_4_;
            auVar63._8_4_ = fVar72 * auVar62._8_4_;
            auVar63._12_4_ = fVar72 * auVar62._12_4_;
            auVar63._16_4_ = fVar72 * auVar62._16_4_;
            auVar63._20_4_ = fVar72 * auVar62._20_4_;
            auVar63._24_4_ = fVar72 * auVar62._24_4_;
            auVar63._28_4_ = auVar62._28_4_;
            auVar62 = vfmadd231ps_avx512vl(auVar63,auVar76,auVar64);
            local_2540 = vfmadd231ps_avx512vl(auVar62,auVar75,auVar65);
            auVar45 = vaddps_avx512vl(auVar53,auVar45);
            auVar47 = vaddps_avx512vl(auVar54,auVar47);
            auVar48 = vaddps_avx512vl(auVar50,auVar48);
            auVar53 = vmulps_avx512vl(auVar47,auVar61);
            auVar53 = vfmsub231ps_avx512vl(auVar53,auVar60,auVar48);
            auVar48 = vmulps_avx512vl(auVar48,auVar59);
            auVar48 = vfmsub231ps_avx512vl(auVar48,auVar61,auVar45);
            auVar50._4_4_ = auVar45._4_4_ * auVar60._4_4_;
            auVar50._0_4_ = auVar45._0_4_ * auVar60._0_4_;
            auVar50._8_4_ = auVar45._8_4_ * auVar60._8_4_;
            auVar50._12_4_ = auVar45._12_4_ * auVar60._12_4_;
            auVar50._16_4_ = auVar45._16_4_ * auVar60._16_4_;
            auVar50._20_4_ = auVar45._20_4_ * auVar60._20_4_;
            auVar50._24_4_ = auVar45._24_4_ * auVar60._24_4_;
            auVar50._28_4_ = auVar45._28_4_;
            auVar39 = vfmsub231ps_fma(auVar50,auVar59,auVar47);
            auVar45 = vmulps_avx512vl(auVar80,ZEXT1632(auVar39));
            auVar45 = vfmadd231ps_avx512vl(auVar45,auVar76,auVar48);
            auVar45 = vfmadd231ps_avx512vl(auVar45,auVar75,auVar53);
            auVar92._0_4_ = local_2540._0_4_ + local_2560._0_4_;
            auVar92._4_4_ = local_2540._4_4_ + local_2560._4_4_;
            auVar92._8_4_ = local_2540._8_4_ + local_2560._8_4_;
            auVar92._12_4_ = local_2540._12_4_ + local_2560._12_4_;
            auVar92._16_4_ = local_2540._16_4_ + local_2560._16_4_;
            auVar92._20_4_ = local_2540._20_4_ + local_2560._20_4_;
            auVar92._24_4_ = local_2540._24_4_ + local_2560._24_4_;
            auVar92._28_4_ = local_2540._28_4_ + local_2560._28_4_;
            local_2520 = vaddps_avx512vl(auVar45,auVar92);
            auVar62 = auVar106._0_32_;
            vandps_avx512vl(local_2520,auVar62);
            auVar53._8_4_ = 0x34000000;
            auVar53._0_8_ = 0x3400000034000000;
            auVar53._12_4_ = 0x34000000;
            auVar53._16_4_ = 0x34000000;
            auVar53._20_4_ = 0x34000000;
            auVar53._24_4_ = 0x34000000;
            auVar53._28_4_ = 0x34000000;
            auVar47 = vmulps_avx512vl(local_2520,auVar53);
            auVar48 = vminps_avx512vl(local_2560,local_2540);
            auVar48 = vminps_avx512vl(auVar48,auVar45);
            auVar53 = vxorps_avx512vl(auVar47,auVar107._0_32_);
            uVar74 = vcmpps_avx512vl(auVar48,auVar53,5);
            auVar48 = vmaxps_avx512vl(local_2560,local_2540);
            auVar45 = vmaxps_avx512vl(auVar48,auVar45);
            uVar13 = vcmpps_avx512vl(auVar45,auVar47,2);
            local_24a0 = (byte)uVar74 | (byte)uVar13;
            if (local_24a0 != 0) {
              auVar45 = vmulps_avx512vl(auVar55,auVar57);
              auVar47 = vmulps_avx512vl(auVar46,auVar58);
              auVar48 = vmulps_avx512vl(auVar49,auVar56);
              auVar53 = vmulps_avx512vl(auVar58,auVar60);
              auVar54 = vmulps_avx512vl(auVar56,auVar61);
              auVar63 = vmulps_avx512vl(auVar57,auVar59);
              auVar49 = vfmsub213ps_avx512vl(auVar49,auVar58,auVar45);
              auVar50 = vfmsub213ps_avx512vl(auVar55,auVar56,auVar47);
              auVar46 = vfmsub213ps_avx512vl(auVar46,auVar57,auVar48);
              auVar55 = vfmsub213ps_avx512vl(auVar61,auVar57,auVar53);
              auVar57 = vfmsub213ps_avx512vl(auVar59,auVar58,auVar54);
              auVar56 = vfmsub213ps_avx512vl(auVar60,auVar56,auVar63);
              vandps_avx512vl(auVar45,auVar62);
              vandps_avx512vl(auVar53,auVar62);
              uVar32 = vcmpps_avx512vl(auVar56,auVar56,1);
              vandps_avx512vl(auVar47,auVar62);
              vandps_avx512vl(auVar54,auVar62);
              uVar12 = vcmpps_avx512vl(auVar56,auVar56,1);
              vandps_avx512vl(auVar48,auVar62);
              vandps_avx512vl(auVar63,auVar62);
              uVar14 = vcmpps_avx512vl(auVar56,auVar56,1);
              bVar9 = (bool)((byte)uVar32 & 1);
              local_2500._0_4_ = (float)((uint)bVar9 * auVar49._0_4_ | (uint)!bVar9 * auVar55._0_4_)
              ;
              bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
              local_2500._4_4_ = (float)((uint)bVar9 * auVar49._4_4_ | (uint)!bVar9 * auVar55._4_4_)
              ;
              bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
              local_2500._8_4_ = (float)((uint)bVar9 * auVar49._8_4_ | (uint)!bVar9 * auVar55._8_4_)
              ;
              bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
              local_2500._12_4_ =
                   (float)((uint)bVar9 * auVar49._12_4_ | (uint)!bVar9 * auVar55._12_4_);
              bVar9 = (bool)((byte)(uVar32 >> 4) & 1);
              local_2500._16_4_ =
                   (float)((uint)bVar9 * auVar49._16_4_ | (uint)!bVar9 * auVar55._16_4_);
              bVar9 = (bool)((byte)(uVar32 >> 5) & 1);
              local_2500._20_4_ =
                   (float)((uint)bVar9 * auVar49._20_4_ | (uint)!bVar9 * auVar55._20_4_);
              bVar9 = (bool)((byte)(uVar32 >> 6) & 1);
              local_2500._24_4_ =
                   (float)((uint)bVar9 * auVar49._24_4_ | (uint)!bVar9 * auVar55._24_4_);
              bVar9 = SUB81(uVar32 >> 7,0);
              local_2500._28_4_ = (uint)bVar9 * auVar49._28_4_ | (uint)!bVar9 * auVar55._28_4_;
              bVar9 = (bool)((byte)uVar12 & 1);
              local_24e0._0_4_ = (float)((uint)bVar9 * auVar50._0_4_ | (uint)!bVar9 * auVar57._0_4_)
              ;
              bVar9 = (bool)((byte)(uVar12 >> 1) & 1);
              local_24e0._4_4_ = (float)((uint)bVar9 * auVar50._4_4_ | (uint)!bVar9 * auVar57._4_4_)
              ;
              bVar9 = (bool)((byte)(uVar12 >> 2) & 1);
              local_24e0._8_4_ = (float)((uint)bVar9 * auVar50._8_4_ | (uint)!bVar9 * auVar57._8_4_)
              ;
              bVar9 = (bool)((byte)(uVar12 >> 3) & 1);
              local_24e0._12_4_ =
                   (float)((uint)bVar9 * auVar50._12_4_ | (uint)!bVar9 * auVar57._12_4_);
              bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
              local_24e0._16_4_ =
                   (float)((uint)bVar9 * auVar50._16_4_ | (uint)!bVar9 * auVar57._16_4_);
              bVar9 = (bool)((byte)(uVar12 >> 5) & 1);
              local_24e0._20_4_ =
                   (float)((uint)bVar9 * auVar50._20_4_ | (uint)!bVar9 * auVar57._20_4_);
              bVar9 = (bool)((byte)(uVar12 >> 6) & 1);
              local_24e0._24_4_ =
                   (float)((uint)bVar9 * auVar50._24_4_ | (uint)!bVar9 * auVar57._24_4_);
              bVar9 = SUB81(uVar12 >> 7,0);
              local_24e0._28_4_ = (uint)bVar9 * auVar50._28_4_ | (uint)!bVar9 * auVar57._28_4_;
              bVar9 = (bool)((byte)uVar14 & 1);
              local_24c0 = (float)((uint)bVar9 * auVar46._0_4_ | (uint)!bVar9 * auVar56._0_4_);
              bVar9 = (bool)((byte)(uVar14 >> 1) & 1);
              fStack_24bc = (float)((uint)bVar9 * auVar46._4_4_ | (uint)!bVar9 * auVar56._4_4_);
              bVar9 = (bool)((byte)(uVar14 >> 2) & 1);
              fStack_24b8 = (float)((uint)bVar9 * auVar46._8_4_ | (uint)!bVar9 * auVar56._8_4_);
              bVar9 = (bool)((byte)(uVar14 >> 3) & 1);
              fStack_24b4 = (float)((uint)bVar9 * auVar46._12_4_ | (uint)!bVar9 * auVar56._12_4_);
              bVar9 = (bool)((byte)(uVar14 >> 4) & 1);
              fStack_24b0 = (float)((uint)bVar9 * auVar46._16_4_ | (uint)!bVar9 * auVar56._16_4_);
              bVar9 = (bool)((byte)(uVar14 >> 5) & 1);
              fStack_24ac = (float)((uint)bVar9 * auVar46._20_4_ | (uint)!bVar9 * auVar56._20_4_);
              bVar9 = (bool)((byte)(uVar14 >> 6) & 1);
              fStack_24a8 = (float)((uint)bVar9 * auVar46._24_4_ | (uint)!bVar9 * auVar56._24_4_);
              bVar9 = SUB81(uVar14 >> 7,0);
              uStack_24a4 = (uint)bVar9 * auVar46._28_4_ | (uint)!bVar9 * auVar56._28_4_;
              auVar22._4_4_ = fVar72 * fStack_24bc;
              auVar22._0_4_ = fVar72 * local_24c0;
              auVar22._8_4_ = fVar72 * fStack_24b8;
              auVar22._12_4_ = fVar72 * fStack_24b4;
              auVar22._16_4_ = fVar72 * fStack_24b0;
              auVar22._20_4_ = fVar72 * fStack_24ac;
              auVar22._24_4_ = fVar72 * fStack_24a8;
              auVar22._28_4_ = fVar72;
              auVar39 = vfmadd213ps_fma(auVar76,local_24e0,auVar22);
              auVar39 = vfmadd213ps_fma(auVar75,local_2500,ZEXT1632(auVar39));
              auVar46 = ZEXT1632(CONCAT412(auVar39._12_4_ + auVar39._12_4_,
                                           CONCAT48(auVar39._8_4_ + auVar39._8_4_,
                                                    CONCAT44(auVar39._4_4_ + auVar39._4_4_,
                                                             auVar39._0_4_ + auVar39._0_4_))));
              auVar77._0_4_ = auVar52._0_4_ * local_24c0;
              auVar77._4_4_ = auVar52._4_4_ * fStack_24bc;
              auVar77._8_4_ = auVar52._8_4_ * fStack_24b8;
              auVar77._12_4_ = auVar52._12_4_ * fStack_24b4;
              auVar77._16_4_ = auVar52._16_4_ * fStack_24b0;
              auVar77._20_4_ = auVar52._20_4_ * fStack_24ac;
              auVar77._24_4_ = auVar52._24_4_ * fStack_24a8;
              auVar77._28_4_ = 0;
              auVar39 = vfmadd213ps_fma(auVar51,local_24e0,auVar77);
              auVar10 = vfmadd213ps_fma(auVar44,local_2500,ZEXT1632(auVar39));
              auVar44 = vrcp14ps_avx512vl(auVar46);
              auVar49 = auVar108._0_32_;
              auVar45 = vfnmadd213ps_avx512vl(auVar44,auVar46,auVar49);
              auVar39 = vfmadd132ps_fma(auVar45,auVar44,auVar44);
              local_2440 = ZEXT1632(CONCAT412((auVar10._12_4_ + auVar10._12_4_) * auVar39._12_4_,
                                              CONCAT48((auVar10._8_4_ + auVar10._8_4_) *
                                                       auVar39._8_4_,
                                                       CONCAT44((auVar10._4_4_ + auVar10._4_4_) *
                                                                auVar39._4_4_,
                                                                (auVar10._0_4_ + auVar10._0_4_) *
                                                                auVar39._0_4_))));
              auVar69 = ZEXT3264(local_2440);
              uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar18._4_4_ = uVar70;
              auVar18._0_4_ = uVar70;
              auVar18._8_4_ = uVar70;
              auVar18._12_4_ = uVar70;
              auVar18._16_4_ = uVar70;
              auVar18._20_4_ = uVar70;
              auVar18._24_4_ = uVar70;
              auVar18._28_4_ = uVar70;
              uVar74 = vcmpps_avx512vl(local_2440,auVar18,0xd);
              auVar44 = vxorps_avx512vl(auVar46,auVar107._0_32_);
              fVar72 = (ray->super_RayK<1>).tfar;
              auVar19._4_4_ = fVar72;
              auVar19._0_4_ = fVar72;
              auVar19._8_4_ = fVar72;
              auVar19._12_4_ = fVar72;
              auVar19._16_4_ = fVar72;
              auVar19._20_4_ = fVar72;
              auVar19._24_4_ = fVar72;
              auVar19._28_4_ = fVar72;
              uVar13 = vcmpps_avx512vl(local_2440,auVar19,2);
              uVar15 = vcmpps_avx512vl(auVar46,auVar44,4);
              local_24a0 = (byte)uVar74 & (byte)uVar13 & (byte)uVar15 & local_24a0;
              uVar38 = (uint)local_24a0;
              if (local_24a0 != 0) {
                local_2700 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar30 = vextractps_avx(local_2700._0_16_,1);
                local_23c0 = 0xf0;
                auVar20._8_4_ = 0x219392ef;
                auVar20._0_8_ = 0x219392ef219392ef;
                auVar20._12_4_ = 0x219392ef;
                auVar20._16_4_ = 0x219392ef;
                auVar20._20_4_ = 0x219392ef;
                auVar20._24_4_ = 0x219392ef;
                auVar20._28_4_ = 0x219392ef;
                uVar32 = vcmpps_avx512vl(local_2520,auVar20,5);
                auVar44 = vrcp14ps_avx512vl(local_2520);
                auVar45 = vfnmadd213ps_avx512vl(local_2520,auVar44,auVar49);
                auVar45 = vfmadd132ps_avx512vl(auVar45,auVar44,auVar44);
                fVar83 = (float)((uint)((byte)uVar32 & 1) * auVar45._0_4_);
                fVar72 = (float)((uint)((byte)(uVar32 >> 1) & 1) * auVar45._4_4_);
                fVar88 = (float)((uint)((byte)(uVar32 >> 2) & 1) * auVar45._8_4_);
                fVar87 = (float)((uint)((byte)(uVar32 >> 3) & 1) * auVar45._12_4_);
                fVar86 = (float)((uint)((byte)(uVar32 >> 4) & 1) * auVar45._16_4_);
                fVar85 = (float)((uint)((byte)(uVar32 >> 5) & 1) * auVar45._20_4_);
                fVar84 = (float)((uint)((byte)(uVar32 >> 6) & 1) * auVar45._24_4_);
                auVar23._4_4_ = fVar72 * local_2560._4_4_;
                auVar23._0_4_ = fVar83 * local_2560._0_4_;
                auVar23._8_4_ = fVar88 * local_2560._8_4_;
                auVar23._12_4_ = fVar87 * local_2560._12_4_;
                auVar23._16_4_ = fVar86 * local_2560._16_4_;
                auVar23._20_4_ = fVar85 * local_2560._20_4_;
                auVar23._24_4_ = fVar84 * local_2560._24_4_;
                auVar23._28_4_ = local_2560._28_4_;
                auVar45 = vminps_avx512vl(auVar23,auVar49);
                auVar24._4_4_ = local_2540._4_4_ * fVar72;
                auVar24._0_4_ = local_2540._0_4_ * fVar83;
                auVar24._8_4_ = local_2540._8_4_ * fVar88;
                auVar24._12_4_ = local_2540._12_4_ * fVar87;
                auVar24._16_4_ = local_2540._16_4_ * fVar86;
                auVar24._20_4_ = local_2540._20_4_ * fVar85;
                auVar24._24_4_ = local_2540._24_4_ * fVar84;
                auVar24._28_4_ = auVar44._28_4_;
                auVar44 = vminps_avx512vl(auVar24,auVar49);
                auVar46 = vsubps_avx512vl(auVar49,auVar45);
                auVar49 = vsubps_avx512vl(auVar49,auVar44);
                local_2460 = vblendps_avx(auVar44,auVar46,0xf0);
                local_2480 = vblendps_avx(auVar45,auVar49,0xf0);
                fVar72 = (float)DAT_01fef940;
                fVar83 = DAT_01fef940._4_4_;
                fVar84 = DAT_01fef940._8_4_;
                fVar85 = DAT_01fef940._12_4_;
                fVar86 = DAT_01fef940._16_4_;
                fVar87 = DAT_01fef940._20_4_;
                fVar88 = DAT_01fef940._24_4_;
                local_2420[0] = local_2500._0_4_ * fVar72;
                local_2420[1] = local_2500._4_4_ * fVar83;
                local_2420[2] = local_2500._8_4_ * fVar84;
                local_2420[3] = local_2500._12_4_ * fVar85;
                fStack_2410 = local_2500._16_4_ * fVar86;
                fStack_240c = local_2500._20_4_ * fVar87;
                fStack_2408 = local_2500._24_4_ * fVar88;
                uStack_2404 = local_2500._28_4_;
                local_2400[0] = local_24e0._0_4_ * fVar72;
                local_2400[1] = local_24e0._4_4_ * fVar83;
                local_2400[2] = local_24e0._8_4_ * fVar84;
                local_2400[3] = local_24e0._12_4_ * fVar85;
                fStack_23f0 = local_24e0._16_4_ * fVar86;
                fStack_23ec = local_24e0._20_4_ * fVar87;
                fStack_23e8 = local_24e0._24_4_ * fVar88;
                uStack_23e4 = local_24e0._28_4_;
                local_23e0[0] = local_24c0 * fVar72;
                local_23e0[1] = fStack_24bc * fVar83;
                local_23e0[2] = fStack_24b8 * fVar84;
                local_23e0[3] = fStack_24b4 * fVar85;
                fStack_23d0 = fStack_24b0 * fVar86;
                fStack_23cc = fStack_24ac * fVar87;
                fStack_23c8 = fStack_24a8 * fVar88;
                uStack_23c4 = uStack_24a4;
                auVar68._8_4_ = 0x7f800000;
                auVar68._0_8_ = 0x7f8000007f800000;
                auVar68._12_4_ = 0x7f800000;
                auVar68._16_4_ = 0x7f800000;
                auVar68._20_4_ = 0x7f800000;
                auVar68._24_4_ = 0x7f800000;
                auVar68._28_4_ = 0x7f800000;
                auVar44 = vblendmps_avx512vl(auVar68,local_2440);
                auVar66._0_4_ =
                     (uint)(local_24a0 & 1) * auVar44._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
                bVar9 = (bool)(local_24a0 >> 1 & 1);
                auVar66._4_4_ = (uint)bVar9 * auVar44._4_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)(local_24a0 >> 2 & 1);
                auVar66._8_4_ = (uint)bVar9 * auVar44._8_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)(local_24a0 >> 3 & 1);
                auVar66._12_4_ = (uint)bVar9 * auVar44._12_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)(local_24a0 >> 4 & 1);
                auVar66._16_4_ = (uint)bVar9 * auVar44._16_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)(local_24a0 >> 5 & 1);
                auVar66._20_4_ = (uint)bVar9 * auVar44._20_4_ | (uint)!bVar9 * 0x7f800000;
                bVar9 = (bool)(local_24a0 >> 6 & 1);
                auVar66._24_4_ = (uint)bVar9 * auVar44._24_4_ | (uint)!bVar9 * 0x7f800000;
                auVar66._28_4_ =
                     (uint)(local_24a0 >> 7) * auVar44._28_4_ |
                     (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
                auVar44 = vshufps_avx(auVar66,auVar66,0xb1);
                auVar44 = vminps_avx(auVar66,auVar44);
                auVar45 = vshufpd_avx(auVar44,auVar44,5);
                auVar44 = vminps_avx(auVar44,auVar45);
                auVar45 = vpermpd_avx2(auVar44,0x4e);
                auVar44 = vminps_avx(auVar44,auVar45);
                uVar74 = vcmpps_avx512vl(auVar66,auVar44,0);
                bVar25 = local_24a0;
                if (((byte)uVar74 & local_24a0) != 0) {
                  bVar25 = (byte)uVar74 & local_24a0;
                }
                do {
                  local_2720 = auVar69._0_32_;
                  uVar17 = 0;
                  for (uVar26 = (uint)bVar25; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000)
                  {
                    uVar17 = uVar17 + 1;
                  }
                  uVar26 = *(uint *)((long)&local_2580 + (ulong)uVar17 * 4);
                  pGVar8 = (local_27a8->geometries).items[uVar26].ptr;
                  if ((pGVar8->mask & uVar30) == 0) {
                    uVar38 = (uint)(byte)(~(byte)(1 << (uVar17 & 0x1f)) & (byte)uVar38);
                  }
                  else {
                    pRVar35 = context->args;
                    if (pRVar35->filter == (RTCFilterFunctionN)0x0) {
                      pRVar31 = context->user;
                      if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar32 = (ulong)(uVar17 << 2);
                        fVar72 = *(float *)(local_2480 + uVar32);
                        fVar83 = *(float *)(local_2460 + uVar32);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar32);
                        (ray->Ng).field_0.field_0.x = *(float *)((long)local_2420 + uVar32);
                        (ray->Ng).field_0.field_0.y = *(float *)((long)local_2400 + uVar32);
                        (ray->Ng).field_0.field_0.z = *(float *)((long)local_23e0 + uVar32);
                        ray->u = fVar72;
                        ray->v = fVar83;
                        ray->primID = *(uint *)((long)&local_26e0 + uVar32);
                        ray->geomID = uVar26;
                        ray->instID[0] = pRVar31->instID[0];
                        ray->instPrimID[0] = pRVar31->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar31 = context->user;
                    }
                    uVar32 = (ulong)(uVar17 * 4);
                    local_2750 = *(float *)((long)local_2420 + uVar32);
                    local_274c = *(undefined4 *)((long)local_2400 + uVar32);
                    local_2748 = *(undefined4 *)((long)local_23e0 + uVar32);
                    local_2744 = *(undefined4 *)(local_2480 + uVar32);
                    local_2740 = *(undefined4 *)(local_2460 + uVar32);
                    local_273c = *(undefined4 *)((long)&local_26e0 + uVar32);
                    local_2738 = uVar26;
                    local_2734 = pRVar31->instID[0];
                    local_2730 = pRVar31->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar32);
                    local_27ac = -1;
                    local_27a0.valid = &local_27ac;
                    local_27a0.geometryUserPtr = pGVar8->userPtr;
                    local_27a0.context = pRVar31;
                    local_27a0.ray = (RTCRayN *)ray;
                    local_27a0.hit = (RTCHitN *)&local_2750;
                    local_27a0.N = 1;
                    if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f280fd:
                      if ((pRVar35->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar35->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*pRVar35->filter)(&local_27a0);
                        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar108 = ZEXT3264(auVar44);
                        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar107 = ZEXT3264(auVar44);
                        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar106 = ZEXT3264(auVar44);
                        if (*local_27a0.valid == 0) goto LAB_01f281be;
                      }
                      (((Vec3f *)((long)local_27a0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_27a0.hit;
                      (((Vec3f *)((long)local_27a0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_27a0.hit + 4);
                      (((Vec3f *)((long)local_27a0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_27a0.hit + 8);
                      *(float *)((long)local_27a0.ray + 0x3c) = *(float *)(local_27a0.hit + 0xc);
                      *(float *)((long)local_27a0.ray + 0x40) = *(float *)(local_27a0.hit + 0x10);
                      *(float *)((long)local_27a0.ray + 0x44) = *(float *)(local_27a0.hit + 0x14);
                      *(float *)((long)local_27a0.ray + 0x48) = *(float *)(local_27a0.hit + 0x18);
                      *(float *)((long)local_27a0.ray + 0x4c) = *(float *)(local_27a0.hit + 0x1c);
                      *(float *)((long)local_27a0.ray + 0x50) = *(float *)(local_27a0.hit + 0x20);
                    }
                    else {
                      local_2770 = pRVar35;
                      (*pGVar8->intersectionFilterN)(&local_27a0);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar108 = ZEXT3264(auVar44);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar107 = ZEXT3264(auVar44);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar106 = ZEXT3264(auVar44);
                      pRVar35 = local_2770;
                      if (*local_27a0.valid != 0) goto LAB_01f280fd;
LAB_01f281be:
                      (ray->super_RayK<1>).tfar = (float)local_2700._0_4_;
                    }
                    fVar72 = (ray->super_RayK<1>).tfar;
                    auVar21._4_4_ = fVar72;
                    auVar21._0_4_ = fVar72;
                    auVar21._8_4_ = fVar72;
                    auVar21._12_4_ = fVar72;
                    auVar21._16_4_ = fVar72;
                    auVar21._20_4_ = fVar72;
                    auVar21._24_4_ = fVar72;
                    auVar21._28_4_ = fVar72;
                    uVar74 = vcmpps_avx512vl(local_2720,auVar21,2);
                    uVar38 = (uint)(byte)(~(byte)(1 << (uVar17 & 0x1f)) & (byte)uVar38) &
                             (uint)uVar74;
                    uVar30 = (ray->super_RayK<1>).mask;
                    local_2700 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  }
                  if ((char)uVar38 == '\0') break;
                  BVHNIntersector1<8,1,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect();
                  auVar69 = ZEXT3264(local_2720);
                  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar108 = ZEXT3264(auVar44);
                  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar107 = ZEXT3264(auVar44);
                  auVar44 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar106 = ZEXT3264(auVar44);
                  bVar25 = (byte)local_27a0.valid;
                } while( true );
              }
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 != local_2758);
        }
        fVar72 = (ray->super_RayK<1>).tfar;
        auVar69 = ZEXT3264(CONCAT428(fVar72,CONCAT424(fVar72,CONCAT420(fVar72,CONCAT416(fVar72,
                                                  CONCAT412(fVar72,CONCAT48(fVar72,CONCAT44(fVar72,
                                                  fVar72))))))));
        auVar79 = ZEXT3264(local_25a0);
        auVar81 = ZEXT3264(local_25c0);
        auVar82 = ZEXT3264(local_25e0);
        auVar90 = ZEXT3264(local_2620);
        auVar93 = ZEXT3264(local_2640);
        auVar101 = ZEXT3264(local_2680);
        auVar102 = ZEXT3264(local_26a0);
        auVar103 = ZEXT3264(local_26c0);
        auVar104 = ZEXT3264(_DAT_01fe9900);
        auVar44 = vbroadcastss_avx512vl(ZEXT416(0xfffffff8));
        auVar105 = ZEXT3264(auVar44);
        uVar32 = local_2768;
        fVar72 = local_2600;
        fVar83 = fStack_25fc;
        fVar84 = fStack_25f8;
        fVar85 = fStack_25f4;
        fVar86 = fStack_25f0;
        fVar87 = fStack_25ec;
        fVar88 = fStack_25e8;
        fVar67 = local_2660;
        fVar95 = fStack_265c;
        fVar96 = fStack_2658;
        fVar97 = fStack_2654;
        fVar98 = fStack_2650;
        fVar99 = fStack_264c;
        fVar100 = fStack_2648;
      }
LAB_01f2831c:
    } while (local_2760 != &local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }